

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

char * get_D3D_register_string
                 (Context *ctx,RegisterType regtype,int regnum,char *regnum_str,size_t regnum_size)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  switch(regtype) {
  case REG_TYPE_TEMP:
    pcVar2 = "r";
    break;
  case REG_TYPE_INPUT:
    pcVar2 = "v";
    break;
  case REG_TYPE_CONST:
    pcVar2 = "c";
    break;
  case REG_TYPE_ADDRESS:
    pcVar2 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar2 = "a";
    }
    break;
  case REG_TYPE_RASTOUT:
    if ((uint)regnum < 3) {
      pcVar3 = &DAT_0012655c + *(int *)(&DAT_0012655c + (ulong)(uint)regnum * 4);
    }
    else {
      pcVar3 = (char *)0x0;
    }
    goto LAB_00111f3d;
  case REG_TYPE_ATTROUT:
    pcVar2 = "oD";
    break;
  case REG_TYPE_OUTPUT:
    if ((ctx->shader_type == MOJOSHADER_TYPE_VERTEX) &&
       (iVar1 = shader_version_atleast(ctx,'\x03','\0'), iVar1 != 0)) {
      pcVar2 = "o";
    }
    else {
      pcVar2 = "oT";
    }
    break;
  case REG_TYPE_CONSTINT:
    pcVar2 = "i";
    break;
  case REG_TYPE_COLOROUT:
    pcVar2 = "oC";
    break;
  case REG_TYPE_DEPTHOUT:
    pcVar3 = "oDepth";
    goto LAB_00111f3d;
  case REG_TYPE_SAMPLER:
    pcVar2 = "s";
    break;
  default:
    fail(ctx,"unknown register type");
    pcVar3 = "???";
    goto LAB_00111f3d;
  case REG_TYPE_CONSTBOOL:
    pcVar2 = "b";
    break;
  case REG_TYPE_LOOP:
    pcVar3 = "aL";
    goto LAB_00111f3d;
  case REG_TYPE_MISCTYPE:
    pcVar2 = (char *)0x0;
    if (regnum == 1) {
      pcVar2 = "vFace";
    }
    pcVar3 = "vPos";
    if (regnum != 0) {
      pcVar3 = pcVar2;
    }
LAB_00111f3d:
    *regnum_str = '\0';
    return pcVar3;
  case REG_TYPE_LABEL:
    pcVar2 = "l";
    break;
  case REG_TYPE_MAX:
    pcVar2 = "p";
  }
  snprintf(regnum_str,0x10,"%u",(ulong)(uint)regnum);
  return pcVar2;
}

Assistant:

static const char *get_D3D_register_string(Context *ctx,
                                           RegisterType regtype,
                                           int regnum, char *regnum_str,
                                           size_t regnum_size)
{
    const char *retval = NULL;
    int has_number = 1;

    switch (regtype)
    {
        case REG_TYPE_TEMP:
            retval = "r";
            break;

        case REG_TYPE_INPUT:
            retval = "v";
            break;

        case REG_TYPE_CONST:
            retval = "c";
            break;

        case REG_TYPE_ADDRESS:  // (or REG_TYPE_TEXTURE, same value.)
            retval = shader_is_vertex(ctx) ? "a" : "t";
            break;

        case REG_TYPE_RASTOUT:
            switch ((RastOutType) regnum)
            {
                case RASTOUT_TYPE_POSITION: retval = "oPos"; break;
                case RASTOUT_TYPE_FOG: retval = "oFog"; break;
                case RASTOUT_TYPE_POINT_SIZE: retval = "oPts"; break;
            } // switch
            has_number = 0;
            break;

        case REG_TYPE_ATTROUT:
            retval = "oD";
            break;

        case REG_TYPE_OUTPUT: // (or REG_TYPE_TEXCRDOUT, same value.)
            if (shader_is_vertex(ctx) && shader_version_atleast(ctx, 3, 0))
                retval = "o";
            else
                retval = "oT";
            break;

        case REG_TYPE_CONSTINT:
            retval = "i";
            break;

        case REG_TYPE_COLOROUT:
            retval = "oC";
            break;

        case REG_TYPE_DEPTHOUT:
            retval = "oDepth";
            has_number = 0;
            break;

        case REG_TYPE_SAMPLER:
            retval = "s";
            break;

        case REG_TYPE_CONSTBOOL:
            retval = "b";
            break;

        case REG_TYPE_LOOP:
            retval = "aL";
            has_number = 0;
            break;

        case REG_TYPE_MISCTYPE:
            switch ((const MiscTypeType) regnum)
            {
                case MISCTYPE_TYPE_POSITION: retval = "vPos"; break;
                case MISCTYPE_TYPE_FACE: retval = "vFace"; break;
            } // switch
            has_number = 0;
            break;

        case REG_TYPE_LABEL:
            retval = "l";
            break;

        case REG_TYPE_PREDICATE:
            retval = "p";
            break;

        //case REG_TYPE_TEMPFLOAT16:  // !!! FIXME: don't know this asm string
        default:
            fail(ctx, "unknown register type");
            retval = "???";
            has_number = 0;
            break;
    } // switch

    if (has_number)
        snprintf(regnum_str, regnum_size, "%u", (uint) regnum);
    else
        regnum_str[0] = '\0';

    return retval;
}